

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int av1_get_compressed_data(AV1_COMP *cpi,AV1_COMP_DATA *cpi_data)

{
  int16_t (*paiVar1) [8];
  int iVar2;
  RefCntBuffer *pRVar3;
  long in_RSI;
  AV1_COMP *in_RDI;
  int result;
  AV1_COMMON *cm;
  AV1EncoderConfig *oxcf;
  int64_t *in_stack_00000180;
  uint *in_stack_00000188;
  size_t in_stack_00000190;
  uint8_t *in_stack_00000198;
  size_t *in_stack_000001a0;
  AV1_COMP *in_stack_000001a8;
  int64_t *in_stack_000001c0;
  aom_rational64_t *in_stack_000001c8;
  int *in_stack_000001d0;
  int in_stack_000001d8;
  AV1_COMMON *in_stack_ffffffffffffffa8;
  AV1_COMP *cpi_00;
  int local_c;
  
  cpi_00 = (AV1_COMP *)&in_RDI->common;
  iVar2 = _setjmp((__jmp_buf_tag *)((in_RDI->common).error)->jmp);
  if (iVar2 == 0) {
    *(undefined4 *)(*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 0xd0) = 1;
    if (in_RDI->ppi->use_svc != 0) {
      av1_one_pass_cbr_svc_start_layer(cpi_00);
    }
    in_RDI->is_dropped_frame = false;
    paiVar1 = (cpi_00->enc_quant_dequant_params).quants.y_quant;
    *(int16_t *)((long)(paiVar1 + 0x1d) + 4) = 0;
    *(int16_t *)((long)(paiVar1 + 0x1d) + 6) = 0;
    *(undefined8 *)(in_RSI + 0x10) = 0;
    in_RDI->available_bs_size = *(size_t *)(in_RSI + 8);
    av1_set_high_precision_mv(in_RDI,1,0);
    *(bool *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x1f] + 2) =
         ((in_RDI->oxcf).tool_cfg.frame_parallel_decoding_mode & 1U) == 0;
    if (((in_RDI->oxcf).tile_cfg.enable_large_scale_tile & 1U) != 0) {
      *(undefined1 *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x1f] + 2) = 0;
    }
    pRVar3 = assign_cur_frame_new_fb(in_stack_ffffffffffffffa8);
    if (pRVar3 == (RefCntBuffer *)0x0) {
      aom_internal_error((in_RDI->common).error,AOM_CODEC_ERROR,"Failed to allocate new cur_frame");
    }
    iVar2 = av1_encode_strategy(in_stack_000001a8,in_stack_000001a0,in_stack_00000198,
                                in_stack_00000190,in_stack_00000188,in_stack_00000180,
                                in_stack_000001c0,in_stack_000001c8,in_stack_000001d0,
                                in_stack_000001d8);
    (in_RDI->rc).use_external_qp_one_pass = 0;
    if (iVar2 == -1) {
      *(undefined4 *)(*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 0xd0) = 0;
      local_c = -1;
    }
    else {
      if (iVar2 != 0) {
        aom_internal_error((in_RDI->common).error,AOM_CODEC_ERROR,"Failed to encode frame");
      }
      *(undefined4 *)(*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 0xd0) = 0;
      local_c = 0;
    }
  }
  else {
    *(undefined4 *)(*(long *)(cpi_00->enc_quant_dequant_params).quants.y_quant[2] + 0xd0) = 0;
    local_c = **(int **)(cpi_00->enc_quant_dequant_params).quants.y_quant[2];
  }
  return local_c;
}

Assistant:

int av1_get_compressed_data(AV1_COMP *cpi, AV1_COMP_DATA *const cpi_data) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  AV1_COMMON *const cm = &cpi->common;

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(cm->error->jmp)) {
    cm->error->setjmp = 0;
    return cm->error->error_code;
  }
  cm->error->setjmp = 1;

#if CONFIG_INTERNAL_STATS
  cpi->frame_recode_hits = 0;
  cpi->time_compress_data = 0;
  cpi->bytes = 0;
#endif
#if CONFIG_ENTROPY_STATS
  if (cpi->compressor_stage == ENCODE_STAGE) {
    av1_zero(cpi->counts);
  }
#endif

#if CONFIG_BITSTREAM_DEBUG
  assert(cpi->oxcf.max_threads <= 1 &&
         "bitstream debug tool does not support multithreading");
  bitstream_queue_record_write();

  if (cm->seq_params->order_hint_info.enable_order_hint) {
    aom_bitstream_queue_set_frame_write(cm->current_frame.order_hint * 2 +
                                        cm->show_frame);
  } else {
    // This is currently used in RTC encoding. cm->show_frame is always 1.
    aom_bitstream_queue_set_frame_write(cm->current_frame.frame_number);
  }
#endif
  if (cpi->ppi->use_svc) {
    av1_one_pass_cbr_svc_start_layer(cpi);
  }

  cpi->is_dropped_frame = false;
  cm->showable_frame = 0;
  cpi_data->frame_size = 0;
  cpi->available_bs_size = cpi_data->cx_data_sz;
#if CONFIG_INTERNAL_STATS
  struct aom_usec_timer cmptimer;
  aom_usec_timer_start(&cmptimer);
#endif
  av1_set_high_precision_mv(cpi, 1, 0);

  // Normal defaults
  cm->features.refresh_frame_context =
      oxcf->tool_cfg.frame_parallel_decoding_mode
          ? REFRESH_FRAME_CONTEXT_DISABLED
          : REFRESH_FRAME_CONTEXT_BACKWARD;
  if (oxcf->tile_cfg.enable_large_scale_tile)
    cm->features.refresh_frame_context = REFRESH_FRAME_CONTEXT_DISABLED;

  if (assign_cur_frame_new_fb(cm) == NULL) {
    aom_internal_error(cpi->common.error, AOM_CODEC_ERROR,
                       "Failed to allocate new cur_frame");
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  // Accumulate 2nd pass time in 2-pass case or 1 pass time in 1-pass case.
  if (cpi->oxcf.pass == 2 || cpi->oxcf.pass == 0)
    start_timing(cpi, av1_encode_strategy_time);
#endif

  const int result = av1_encode_strategy(
      cpi, &cpi_data->frame_size, cpi_data->cx_data, cpi_data->cx_data_sz,
      &cpi_data->lib_flags, &cpi_data->ts_frame_start, &cpi_data->ts_frame_end,
      cpi_data->timestamp_ratio, &cpi_data->pop_lookahead, cpi_data->flush);

#if CONFIG_COLLECT_COMPONENT_TIMING
  if (cpi->oxcf.pass == 2 || cpi->oxcf.pass == 0)
    end_timing(cpi, av1_encode_strategy_time);

  // Print out timing information.
  // Note: Use "cpi->frame_component_time[0] > 100 us" to avoid showing of
  // show_existing_frame and lag-in-frames.
  if ((cpi->oxcf.pass == 2 || cpi->oxcf.pass == 0) &&
      cpi->frame_component_time[0] > 100) {
    int i;
    uint64_t frame_total = 0, total = 0;
    const GF_GROUP *const gf_group = &cpi->ppi->gf_group;
    FRAME_UPDATE_TYPE frame_update_type =
        get_frame_update_type(gf_group, cpi->gf_frame_index);

    fprintf(stderr,
            "\n Frame number: %d, Frame type: %s, Show Frame: %d, Frame Update "
            "Type: %d, Q: %d\n",
            cm->current_frame.frame_number,
            get_frame_type_enum(cm->current_frame.frame_type), cm->show_frame,
            frame_update_type, cm->quant_params.base_qindex);
    for (i = 0; i < kTimingComponents; i++) {
      cpi->component_time[i] += cpi->frame_component_time[i];
      // Use av1_encode_strategy_time (i = 0) as the total time.
      if (i == 0) {
        frame_total = cpi->frame_component_time[0];
        total = cpi->component_time[0];
      }
      fprintf(stderr,
              " %50s:  %15" PRId64 " us [%6.2f%%] (total: %15" PRId64
              " us [%6.2f%%])\n",
              get_component_name(i), cpi->frame_component_time[i],
              (float)((float)cpi->frame_component_time[i] * 100.0 /
                      (float)frame_total),
              cpi->component_time[i],
              (float)((float)cpi->component_time[i] * 100.0 / (float)total));
      cpi->frame_component_time[i] = 0;
    }
  }
#endif

  // Reset the flag to 0 afer encoding.
  cpi->rc.use_external_qp_one_pass = 0;

  if (result == -1) {
    cm->error->setjmp = 0;
    // Returning -1 indicates no frame encoded; more input is required
    return -1;
  }
  if (result != AOM_CODEC_OK) {
    aom_internal_error(cpi->common.error, AOM_CODEC_ERROR,
                       "Failed to encode frame");
  }
#if CONFIG_INTERNAL_STATS
  aom_usec_timer_mark(&cmptimer);
  cpi->time_compress_data += aom_usec_timer_elapsed(&cmptimer);
#endif  // CONFIG_INTERNAL_STATS

#if CONFIG_SPEED_STATS
  if (!is_stat_generation_stage(cpi) && !cm->show_existing_frame) {
    cpi->tx_search_count += cpi->td.mb.txfm_search_info.tx_search_count;
    cpi->td.mb.txfm_search_info.tx_search_count = 0;
  }
#endif  // CONFIG_SPEED_STATS

  cm->error->setjmp = 0;
  return AOM_CODEC_OK;
}